

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_iny_sets_n_flag_Test::~CpuTest_iny_sets_n_flag_Test
          (CpuTest_iny_sets_n_flag_Test *this)

{
  CpuTest_iny_sets_n_flag_Test *this_local;
  
  ~CpuTest_iny_sets_n_flag_Test(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuTest, iny_sets_n_flag) {
    stage_instruction(INY);
    registers.y = 127;
    expected.y = 128;
    expected.p |= N_FLAG;

    step_execution(2);
    EXPECT_EQ(expected, registers);
}